

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InetAddress.cpp
# Opt level: O1

void __thiscall
sznet::net::InetAddress::InetAddress(InetAddress *this,uint16_t port,bool loopbackOnly,bool ipv6)

{
  in_port_t iVar1;
  uint32_t uVar2;
  undefined8 uVar3;
  undefined8 *puVar4;
  undefined4 uVar5;
  undefined7 in_register_00000009;
  
  if ((int)CONCAT71(in_register_00000009,ipv6) == 0) {
    *(undefined8 *)&this->field_0 = 0;
    *(undefined8 *)((long)&this->field_0 + 8) = 0;
    (this->field_0).m_addr.sin_family = 2;
    uVar5 = 0x7f000001;
    if (!loopbackOnly) {
      uVar5 = 0;
    }
    uVar2 = swap_bytes(uVar5);
    (this->field_0).m_addr6.sin6_flowinfo = uVar2;
  }
  else {
    *(undefined8 *)&this->field_0 = 0;
    *(undefined8 *)((long)&this->field_0 + 8) = 0;
    *(undefined8 *)((long)&this->field_0 + 0xc) = 0;
    *(undefined8 *)((long)&this->field_0 + 0x14) = 0;
    (this->field_0).m_addr.sin_family = 10;
    if (loopbackOnly) {
      puVar4 = (undefined8 *)&in6addr_loopback;
    }
    else {
      puVar4 = (undefined8 *)&in6addr_any;
    }
    uVar3 = puVar4[1];
    *(undefined8 *)((long)&this->field_0 + 8) = *puVar4;
    *(undefined8 *)((long)&this->field_0 + 0x10) = uVar3;
  }
  iVar1 = swap_bytes(port);
  (this->field_0).m_addr.sin_port = iVar1;
  return;
}

Assistant:

InetAddress::InetAddress(uint16_t port, bool loopbackOnly, bool ipv6)
{
	static_assert(offsetof(InetAddress, m_addr6) == 0, "m_addr6 offset 0");
	static_assert(offsetof(InetAddress, m_addr) == 0, "m_addr offset 0");
	if (ipv6)
	{
		memset(&m_addr6, 0, sizeof(m_addr6));
		m_addr6.sin6_family = AF_INET6;
		in6_addr ip = loopbackOnly ? in6addr_loopback : in6addr_any;
		m_addr6.sin6_addr = ip;
		m_addr6.sin6_port = sockets::hostToNetwork16(port);
	}
	else
	{
		memset(&m_addr, 0, sizeof(m_addr));
		m_addr.sin_family = AF_INET;
		auto ip = loopbackOnly ? INADDR_LOOPBACK : INADDR_ANY;
		m_addr.sin_addr.s_addr = sockets::hostToNetwork32(ip);
		m_addr.sin_port = sockets::hostToNetwork16(port);
	}
}